

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

lws_http_mount * lws_find_mount(lws *wsi,char *uri_ptr,int uri_len)

{
  byte bVar1;
  int iVar2;
  lws_http_mount *plStack_30;
  int best;
  lws_http_mount *hit;
  lws_http_mount *hm;
  int uri_len_local;
  char *uri_ptr_local;
  lws *wsi_local;
  
  plStack_30 = (lws_http_mount *)0x0;
  bVar1 = 0;
  for (hit = (wsi->vhost->http).mount_list; hit != (lws_http_mount *)0x0; hit = hit->mount_next) {
    if (((((int)(uint)hit->mountpoint_len <= uri_len) &&
         (iVar2 = strncmp(uri_ptr,hit->mountpoint,(ulong)hit->mountpoint_len), iVar2 == 0)) &&
        ((uri_ptr[hit->mountpoint_len] == '\0' ||
         ((uri_ptr[hit->mountpoint_len] == '/' || (hit->mountpoint_len == '\x01')))))) &&
       ((hit->origin_protocol == '\x06' ||
        (((((hit->origin_protocol == '\x03' ||
            (iVar2 = lws_hdr_total_length(wsi,WSI_TOKEN_GET_URI), iVar2 != 0)) ||
           (iVar2 = lws_hdr_total_length(wsi,WSI_TOKEN_POST_URI), iVar2 != 0)) ||
          (((iVar2 = lws_hdr_total_length(wsi,WSI_TOKEN_HEAD_URI), iVar2 != 0 ||
            (((*(ulong *)&wsi->field_0x2dc >> 1 & 1) != 0 &&
             (iVar2 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_COLON_PATH), iVar2 != 0)))) ||
           (hit->protocol != (char *)0x0)))) && (bVar1 < hit->mountpoint_len)))))) {
      bVar1 = hit->mountpoint_len;
      plStack_30 = hit;
    }
  }
  return plStack_30;
}

Assistant:

const struct lws_http_mount *
lws_find_mount(struct lws *wsi, const char *uri_ptr, int uri_len)
{
	const struct lws_http_mount *hm, *hit = NULL;
	int best = 0;

	hm = wsi->vhost->http.mount_list;
	while (hm) {
		if (uri_len >= hm->mountpoint_len &&
		    !strncmp(uri_ptr, hm->mountpoint, hm->mountpoint_len) &&
		    (uri_ptr[hm->mountpoint_len] == '\0' ||
		     uri_ptr[hm->mountpoint_len] == '/' ||
		     hm->mountpoint_len == 1)
		    ) {
			if (hm->origin_protocol == LWSMPRO_CALLBACK ||
			    ((hm->origin_protocol == LWSMPRO_CGI ||
			     lws_hdr_total_length(wsi, WSI_TOKEN_GET_URI) ||
			     lws_hdr_total_length(wsi, WSI_TOKEN_POST_URI) ||
			     lws_hdr_total_length(wsi, WSI_TOKEN_HEAD_URI) ||
			     (wsi->mux_substream &&
				lws_hdr_total_length(wsi,
						WSI_TOKEN_HTTP_COLON_PATH)) ||
			     hm->protocol) &&
			    hm->mountpoint_len > best)) {
				best = hm->mountpoint_len;
				hit = hm;
			}
		}
		hm = hm->mount_next;
	}

	return hit;
}